

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_as_double(void)

{
  byte bVar1;
  int iVar2;
  double dVar3;
  bson_t b;
  bson_iter_t iter;
  undefined1 auStack_180 [128];
  undefined1 local_100 [248];
  
  bson_init(auStack_180);
  bVar1 = bson_append_double(0x4093487e5c91d14e,auStack_180,"key",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x170,"test_bson_iter_as_double","bson_append_double (&b, \"key\", -1, 1234.1234)");
    abort();
  }
  bVar1 = bson_iter_init_find(local_100,auStack_180,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x171,"test_bson_iter_as_double","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x172,"test_bson_iter_as_double","BSON_ITER_HOLDS_DOUBLE (&iter)");
    abort();
  }
  dVar3 = (double)bson_iter_as_double(local_100);
  if (dVar3 != 1234.1234) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x173,"test_bson_iter_as_double","bson_iter_as_double (&iter) == 1234.1234");
    abort();
  }
  bson_destroy(auStack_180);
  bson_init(auStack_180);
  bVar1 = bson_append_int32(auStack_180,"key",0xffffffff,0x4d2);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x177,"test_bson_iter_as_double","bson_append_int32 (&b, \"key\", -1, 1234)");
    abort();
  }
  bVar1 = bson_iter_init_find(local_100,auStack_180,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x178,"test_bson_iter_as_double","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 0x10) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x179,"test_bson_iter_as_double","BSON_ITER_HOLDS_INT32 (&iter)");
    abort();
  }
  dVar3 = (double)bson_iter_as_double(local_100);
  if (dVar3 != 1234.0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x17a,"test_bson_iter_as_double","bson_iter_as_double (&iter) == 1234.0");
    abort();
  }
  bson_destroy(auStack_180);
  bson_init(auStack_180);
  bVar1 = bson_append_int64(auStack_180,"key",0xffffffff,0x10e1);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x17e,"test_bson_iter_as_double","bson_append_int64 (&b, \"key\", -1, 4321)");
    abort();
  }
  bVar1 = bson_iter_init_find(local_100,auStack_180,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x17f,"test_bson_iter_as_double","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 0x12) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x180,"test_bson_iter_as_double","BSON_ITER_HOLDS_INT64 (&iter)");
    abort();
  }
  dVar3 = (double)bson_iter_as_double(local_100);
  if (dVar3 != 4321.0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x181,"test_bson_iter_as_double","bson_iter_as_double (&iter) == 4321.0");
    abort();
  }
  bson_destroy(auStack_180);
  return;
}

Assistant:

static void
test_bson_iter_as_double (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   ASSERT (bson_append_double (&b, "key", -1, 1234.1234));
   ASSERT (bson_iter_init_find (&iter, &b, "key"));
   ASSERT (BSON_ITER_HOLDS_DOUBLE (&iter));
   ASSERT (bson_iter_as_double (&iter) == 1234.1234);
   bson_destroy (&b);

   bson_init (&b);
   ASSERT (bson_append_int32 (&b, "key", -1, 1234));
   ASSERT (bson_iter_init_find (&iter, &b, "key"));
   ASSERT (BSON_ITER_HOLDS_INT32 (&iter));
   ASSERT (bson_iter_as_double (&iter) == 1234.0);
   bson_destroy (&b);

   bson_init (&b);
   ASSERT (bson_append_int64 (&b, "key", -1, 4321));
   ASSERT (bson_iter_init_find (&iter, &b, "key"));
   ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   ASSERT (bson_iter_as_double (&iter) == 4321.0);
   bson_destroy (&b);
}